

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::DiffEnum<_khr_df_primaries_e>::DiffEnum
          (DiffEnum<_khr_df_primaries_e> *this,string_view textHeaderIn,string_view jsonPathIn,
          optional<int> *value1,optional<int> *value2,function<const_char_*(unsigned_long)> *strFunc
          )

{
  string_view jsonPathIn_00;
  string_view textHeaderIn_00;
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  DiffBase<_khr_df_primaries_e> *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  function<const_char_*(unsigned_long)> *in_RDI;
  size_t in_R8;
  char *in_R9;
  _khr_df_primaries_e *in_stack_ffffffffffffff88;
  undefined1 *__args;
  undefined1 local_64 [8];
  int local_5c;
  optional<_khr_df_primaries_e> *in_stack_ffffffffffffffa8;
  DiffBase<_khr_df_primaries_e> *value2_00;
  
  value2_00 = in_RCX;
  bVar1 = std::optional<int>::has_value((optional<int> *)0x1788fe);
  if (bVar1) {
    piVar2 = std::optional<int>::operator*((optional<int> *)0x17890e);
    local_5c = *piVar2;
    std::optional<_khr_df_primaries_e>::optional<_khr_df_primaries_e,_true>
              ((optional<_khr_df_primaries_e> *)in_RDI,in_stack_ffffffffffffff88);
  }
  else {
    std::optional<_khr_df_primaries_e>::optional((optional<_khr_df_primaries_e> *)0x17892f);
  }
  bVar1 = std::optional<int>::has_value((optional<int> *)0x17893c);
  if (bVar1) {
    std::optional<int>::operator*((optional<int> *)0x17894f);
    std::optional<_khr_df_primaries_e>::optional<_khr_df_primaries_e,_true>
              ((optional<_khr_df_primaries_e> *)in_RDI,in_stack_ffffffffffffff88);
  }
  else {
    std::optional<_khr_df_primaries_e>::optional((optional<_khr_df_primaries_e> *)0x178970);
  }
  __args = local_64;
  textHeaderIn_00._M_str = in_R9;
  textHeaderIn_00._M_len = in_RDX;
  jsonPathIn_00._M_str = in_RSI;
  jsonPathIn_00._M_len = in_R8;
  DiffBase<_khr_df_primaries_e>::DiffBase
            (in_RCX,textHeaderIn_00,jsonPathIn_00,in_stack_ffffffffffffffa8,
             (optional<_khr_df_primaries_e> *)value2_00);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR_value_abi_cxx11__00430418;
  *(undefined1 *)((long)&in_RDI[1]._M_invoker + 1) = 0;
  *(_Optional_payload_base<_khr_df_primaries_e> *)&in_RDI[2].super__Function_base._M_functor =
       (_Optional_payload_base<_khr_df_primaries_e>)0x0;
  *(undefined8 *)((long)&in_RDI[2].super__Function_base._M_functor + 8) = 0;
  bVar1 = std::optional<int>::has_value((optional<int> *)0x1789cd);
  if (bVar1) {
    pcVar3 = std::function<const_char_*(unsigned_long)>::operator()(in_RDI,(unsigned_long)__args);
    *(char **)&in_RDI[2].super__Function_base._M_functor = pcVar3;
  }
  bVar1 = std::optional<int>::has_value((optional<int> *)0x1789fd);
  if (bVar1) {
    pcVar3 = std::function<const_char_*(unsigned_long)>::operator()(in_RDI,(unsigned_long)__args);
    *(char **)((long)&in_RDI[2].super__Function_base._M_functor + 8) = pcVar3;
  }
  return;
}

Assistant:

DiffEnum(const std::string_view textHeaderIn, const std::string_view jsonPathIn,
        const std::optional<int32_t>& value1, const std::optional<int32_t>& value2,
        const std::function<const char*(std::size_t)>& strFunc)
        : DiffBase<T>(textHeaderIn, jsonPathIn,
            value1.has_value() ? T(*value1) : std::optional<T>(),
            value2.has_value() ? T(*value2) : std::optional<T>()) {
        if (value1.has_value()) enumNames[0] = strFunc(0);
        if (value2.has_value()) enumNames[1] = strFunc(1);
    }